

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ExtPubkey *
cfd::core::ConfidentialTransaction::GenerateExtPubkeyFromDescriptor
          (ExtPubkey *__return_storage_ptr__,string *bitcoin_descriptor,uint32_t bip32_counter,
          ByteData *prefix,NetType net_type,NetType elements_net_type,ExtPubkey *base_ext_pubkey,
          Address *descriptor_derive_address)

{
  Pubkey *this;
  ByteData256 *this_00;
  char *pcVar1;
  uint uVar2;
  pointer pcVar3;
  void *pvVar4;
  char cVar5;
  bool bVar6;
  char cVar7;
  NetType NVar8;
  Bip32FormatType BVar9;
  AddressType AVar10;
  int iVar11;
  long *plVar12;
  CfdException *pCVar13;
  DescriptorKeyReference *pDVar14;
  size_type *psVar15;
  uint32_t uVar16;
  string desc_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list_base;
  DescriptorScriptReference derive_script;
  ExtPubkey xpub;
  DescriptorScriptReference script_ref;
  Descriptor desc;
  DescriptorKeyReference key_ref;
  string local_1058;
  ByteData *local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  NetType local_100c;
  string local_1008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fe8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fc8;
  Privkey *local_fa8;
  ByteData256 *local_fa0;
  ByteData local_f98;
  ByteData local_f80;
  undefined1 local_f68 [8];
  undefined1 local_f60 [8];
  undefined1 local_f58 [24];
  ByteData256 local_f40;
  undefined1 local_f28 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  ByteData local_f08;
  undefined1 local_ef0 [16];
  _Alloc_hider local_ee0;
  TapBranch local_d60;
  TapBranch local_cd8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_c58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c38;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_c30;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_c18;
  undefined1 local_c00 [8];
  undefined1 local_bf8 [8];
  undefined1 local_bf0 [64];
  pointer local_bb0;
  pointer local_ba8;
  ByteData local_ba0;
  undefined1 local_b88 [16];
  pointer local_b78;
  TapBranch local_9f8;
  TapBranch local_970;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_8f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8d0;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_8c8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_8b0;
  Extkey local_898;
  undefined1 local_808 [40];
  pointer local_7e0;
  pointer local_7d0;
  pointer local_7c8;
  Script local_7c0;
  undefined1 local_788 [392];
  TapBranch local_600;
  TapBranch local_578;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_4f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d8;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_4d0;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_4b8;
  DescriptorNode local_4a0;
  DescriptorKeyReference local_330;
  
  local_1038 = prefix;
  if (kRegtest < net_type) {
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_808._0_8_ = local_808 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_808,"Illegal bitcoin network type error.","");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_808);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (elements_net_type < kLiquidV1) {
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_808._0_8_ = local_808 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_808,"Illegal elements network type error.","");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_808);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar2 = *(uint *)(&DAT_00628058 + (ulong)net_type * 4);
  local_100c = net_type;
  ExtPubkey::ExtPubkey(__return_storage_ptr__);
  ExtPubkey::ExtPubkey((ExtPubkey *)&local_898);
  local_1008._M_dataplus._M_p = (pointer)&local_1008.field_2;
  pcVar3 = (bitcoin_descriptor->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1008,pcVar3,pcVar3 + bitcoin_descriptor->_M_string_length);
  ExtPubkey::ExtPubkey((ExtPubkey *)local_808,bitcoin_descriptor);
  NVar8 = Extkey::GetNetworkType((Extkey *)local_808);
  bVar6 = ByteData::IsEmpty(local_1038);
  if (bVar6) {
    bVar6 = false;
  }
  else {
    Extkey::GetVersionData(&local_f80,(Extkey *)local_808);
    bVar6 = ByteData::Equals(&local_f80,local_1038);
    if (local_f80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f80.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f80.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f80.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (bVar6 == false) {
    if (uVar2 != (NVar8 == kMainnet)) goto LAB_003b30ce;
    BVar9 = Extkey::GetFormatType((Extkey *)local_808);
    if (BVar9 == kBip84) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f68,"wpkh(",bitcoin_descriptor);
      plVar12 = (long *)::std::__cxx11::string::append(local_f68);
    }
    else if (BVar9 == kBip49) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f68,"sh(wpkh(",bitcoin_descriptor);
      plVar12 = (long *)::std::__cxx11::string::append(local_f68);
    }
    else {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f68,"pkh(",bitcoin_descriptor);
      plVar12 = (long *)::std::__cxx11::string::append(local_f68);
    }
  }
  else {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f68,
                     "pkh(",bitcoin_descriptor);
    plVar12 = (long *)::std::__cxx11::string::append(local_f68);
  }
  pDVar14 = (DescriptorKeyReference *)(plVar12 + 2);
  if ((DescriptorKeyReference *)*plVar12 == pDVar14) {
    local_bf0._0_8_ = *(undefined8 *)pDVar14;
    local_bf0._8_8_ = plVar12[3];
    local_c00 = (undefined1  [8])local_bf0;
  }
  else {
    local_bf0._0_8_ = *(undefined8 *)pDVar14;
    local_c00 = (undefined1  [8])*plVar12;
  }
  local_bf8 = (undefined1  [8])plVar12[1];
  *plVar12 = (long)pDVar14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)&local_1008,(string *)local_c00);
  if (local_c00 != (undefined1  [8])local_bf0) {
    operator_delete((void *)local_c00,(ulong)(local_bf0._0_8_ + 1));
  }
  if (local_f68 != (undefined1  [8])local_f58) {
    operator_delete((void *)local_f68,local_f58._0_8_ + 1);
  }
LAB_003b30ce:
  if (local_7c0.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_7c0.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    local_788._8_8_ -
                    (long)local_7c0.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_7c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_7c0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)local_7c0.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_7c0.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (local_7c8 != (pointer)0x0) {
    operator_delete(local_7c8,
                    (long)local_7c0.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)local_7c8);
  }
  if (local_7e0 != (pointer)0x0) {
    operator_delete(local_7e0,(long)local_7d0 - (long)local_7e0);
  }
  pvVar4 = (void *)CONCAT44(local_808._12_4_,local_808._8_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,local_808._24_8_ - (long)pvVar4);
  }
  local_fc8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_fc8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fc8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_808 + 0x10;
  local_808._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"base","");
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_fc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808);
  if ((char *)local_808._0_8_ != pcVar1) {
    operator_delete((void *)local_808._0_8_,(ulong)(local_808._16_8_ + 1));
  }
  local_fe8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_fe8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fe8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar7 = '\x01';
  if (9 < bip32_counter) {
    uVar16 = bip32_counter;
    cVar5 = '\x04';
    do {
      cVar7 = cVar5;
      if (uVar16 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_003b3236;
      }
      if (uVar16 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_003b3236;
      }
      if (uVar16 < 10000) goto LAB_003b3236;
      bVar6 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar5 = cVar7 + '\x04';
    } while (bVar6);
    cVar7 = cVar7 + '\x01';
  }
LAB_003b3236:
  local_808._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct((ulong)local_808,cVar7);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_808._0_8_,local_808._8_4_,bip32_counter);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_fe8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808);
  if ((char *)local_808._0_8_ != pcVar1) {
    operator_delete((void *)local_808._0_8_,(ulong)(local_808._16_8_ + 1));
  }
  Descriptor::Parse((Descriptor *)&local_4a0,&local_1008,
                    (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)0x0,kMainnet);
  Descriptor::GetReference
            ((DescriptorScriptReference *)local_808,(Descriptor *)&local_4a0,&local_fc8);
  AVar10 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_808);
  if ((kP2shP2wpkhAddress < AVar10) || ((0x54U >> (AVar10 & 0x1f) & 1) == 0)) {
    local_c00 = (undefined1  [8])0x62697b;
    local_bf8._0_4_ = 0xdd2;
    local_bf0._0_8_ = "GenerateExtPubkeyFromDescriptor";
    logger::log<>((CfdSourceLocation *)local_c00,kCfdLogLevelWarning,
                  "bitcoin_descriptor invalid type.");
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c00 = (undefined1  [8])local_bf0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c00,
               "bitcoin_descriptor is not of any type supported: pkh(<xpub>), sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>."
               ,"");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_c00);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  AVar10 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_808);
  if (AVar10 == kP2shP2wpkhAddress) {
    DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)local_c00,(DescriptorScriptReference *)local_808);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_808,(DescriptorScriptReference *)local_c00);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_8b0);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&local_8c8);
    if (local_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8d0._M_pi);
    }
    local_970._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_8f0);
    TapBranch::~TapBranch(&local_970);
    TapBranch::~TapBranch(&local_9f8);
    core::Address::~Address((Address *)(local_b88 + 8));
    Script::~Script((Script *)(local_bf0 + 0x38));
    Script::~Script((Script *)local_bf8);
  }
  DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)local_c00,(DescriptorScriptReference *)local_808);
  DescriptorKeyReference::DescriptorKeyReference(&local_330,(DescriptorKeyReference *)local_c00);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           *)local_c00);
  bVar6 = DescriptorKeyReference::HasExtPubkey(&local_330);
  if (!bVar6) {
    local_c00 = (undefined1  [8])0x62697b;
    local_bf8._0_4_ = 0xdde;
    local_bf0._0_8_ = "GenerateExtPubkeyFromDescriptor";
    logger::log<>((CfdSourceLocation *)local_c00,kCfdLogLevelWarning,
                  "bitcoin_descriptor invalid extkey format.");
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c00 = (undefined1  [8])local_bf0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c00,"BitcoinDescriptor invalid extkey format.","");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_c00);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_c00,&local_330);
  (base_ext_pubkey->super_Extkey).version_ = local_c00._0_4_;
  ByteData::operator=(&(base_ext_pubkey->super_Extkey).fingerprint_,(ByteData *)local_bf8);
  (base_ext_pubkey->super_Extkey).depth_ = local_bf0[0x10];
  *(undefined3 *)&(base_ext_pubkey->super_Extkey).field_0x21 = local_bf0._17_3_;
  (base_ext_pubkey->super_Extkey).child_num_ = local_bf0._20_4_;
  ByteData256::operator=
            (&(base_ext_pubkey->super_Extkey).chaincode_,(ByteData256 *)(local_bf0 + 0x18));
  ByteData::operator=(&(base_ext_pubkey->super_Extkey).privkey_.data_,(ByteData *)(local_bf0 + 0x30)
                     );
  *(pointer *)&(base_ext_pubkey->super_Extkey).privkey_.is_compressed_ = local_ba8;
  ByteData::operator=(&(base_ext_pubkey->super_Extkey).pubkey_.data_,&local_ba0);
  ByteData256::operator=(&(base_ext_pubkey->super_Extkey).tweak_sum_,(ByteData256 *)local_b88);
  if ((pointer)local_b88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b88._0_8_,(long)local_b78 - local_b88._0_8_);
  }
  if (local_ba0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ba0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_ba0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ba0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_bf0._48_8_ != (pointer)0x0) {
    operator_delete((void *)local_bf0._48_8_,(long)local_bb0 - local_bf0._48_8_);
  }
  if ((pointer)local_bf0._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_bf0._24_8_,local_bf0._40_8_ - local_bf0._24_8_);
  }
  if (local_bf8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_bf8,local_bf0._8_8_ - (long)local_bf8);
  }
  bVar6 = ByteData::IsEmpty(local_1038);
  if (bVar6) {
    bVar6 = false;
  }
  else {
    Extkey::GetVersionData(&local_f98,&base_ext_pubkey->super_Extkey);
    bVar6 = ByteData::Equals(&local_f98,local_1038);
    bVar6 = !bVar6;
    if (local_f98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f98.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (bVar6) {
    local_f68 = (undefined1  [8])0x62697b;
    local_f60._0_4_ = 0xde5;
    local_f58._0_8_ = "GenerateExtPubkeyFromDescriptor";
    Extkey::GetVersionData((ByteData *)&local_1058,&local_898);
    ByteData::GetHex_abi_cxx11_((string *)local_c00,(ByteData *)&local_1058);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_f68,kCfdLogLevelWarning,
               "bitcoin_descriptor illegal prefix[{}].",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c00);
    if (local_c00 != (undefined1  [8])local_bf0) {
      operator_delete((void *)local_c00,(ulong)(local_bf0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1058._M_dataplus._M_p,
                      local_1058.field_2._M_allocated_capacity - (long)local_1058._M_dataplus._M_p);
    }
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c00 = (undefined1  [8])local_bf0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c00,"bitcoin_descriptor illegal prefix.","");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_c00);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  DescriptorScriptReference::DescriptorScriptReference((DescriptorScriptReference *)local_c00);
  Descriptor::GetReference
            ((DescriptorScriptReference *)local_f68,(Descriptor *)&local_4a0,&local_fe8);
  DescriptorScriptReference::operator=
            ((DescriptorScriptReference *)local_c00,(DescriptorScriptReference *)local_f68);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  ~vector(&local_c18);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector(&local_c30);
  if (local_c38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c38._M_pi);
  }
  local_cd8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_c58);
  TapBranch::~TapBranch(&local_cd8);
  TapBranch::~TapBranch(&local_d60);
  core::Address::~Address((Address *)(local_ef0 + 8));
  Script::~Script((Script *)(local_f28 + 8));
  Script::~Script((Script *)local_f60);
  DescriptorScriptReference::operator=
            ((DescriptorScriptReference *)local_808,(DescriptorScriptReference *)local_c00);
  AVar10 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_808);
  if (AVar10 == kP2shP2wpkhAddress) {
    DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)local_f68,(DescriptorScriptReference *)local_808);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_808,(DescriptorScriptReference *)local_f68);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_c18);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&local_c30);
    if (local_c38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c38._M_pi);
    }
    local_cd8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_c58);
    TapBranch::~TapBranch(&local_cd8);
    TapBranch::~TapBranch(&local_d60);
    core::Address::~Address((Address *)(local_ef0 + 8));
    Script::~Script((Script *)(local_f28 + 8));
    Script::~Script((Script *)local_f60);
  }
  DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)local_f68,(DescriptorScriptReference *)local_808);
  DescriptorKeyReference::operator=(&local_330,(DescriptorKeyReference *)local_f68);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           *)local_f68);
  DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_f68,&local_330);
  (__return_storage_ptr__->super_Extkey).version_ = local_f68._0_4_;
  local_1038 = &(__return_storage_ptr__->super_Extkey).fingerprint_;
  ByteData::operator=(local_1038,(ByteData *)local_f60);
  (__return_storage_ptr__->super_Extkey).depth_ = local_f58[0x10];
  *(undefined3 *)&(__return_storage_ptr__->super_Extkey).field_0x21 = local_f58._17_3_;
  (__return_storage_ptr__->super_Extkey).child_num_ = local_f58._20_4_;
  local_fa0 = &(__return_storage_ptr__->super_Extkey).chaincode_;
  ByteData256::operator=(local_fa0,&local_f40);
  local_fa8 = &(__return_storage_ptr__->super_Extkey).privkey_;
  ByteData::operator=(&local_fa8->data_,(ByteData *)local_f28);
  (__return_storage_ptr__->super_Extkey).privkey_.is_compressed_ = (bool)local_f18._8_1_;
  *(undefined3 *)&(__return_storage_ptr__->super_Extkey).privkey_.field_0x19 = local_f18._9_3_;
  (__return_storage_ptr__->super_Extkey).privkey_.net_type_ = local_f18._12_4_;
  this = &(__return_storage_ptr__->super_Extkey).pubkey_;
  ByteData::operator=(&this->data_,&local_f08);
  this_00 = &(__return_storage_ptr__->super_Extkey).tweak_sum_;
  ByteData256::operator=(this_00,(ByteData256 *)local_ef0);
  if ((pointer)local_ef0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ef0._0_8_,(long)local_ee0._M_p - local_ef0._0_8_);
  }
  if (local_f08.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f08.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f08.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f08.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_f28._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f28._0_8_,local_f18._M_allocated_capacity - local_f28._0_8_);
  }
  if ((pointer)local_f40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f40.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f40.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f40.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f60,local_f58._8_8_ - (long)local_f60);
  }
  Extkey::ToString_abi_cxx11_((string *)local_f68,&__return_storage_ptr__->super_Extkey);
  Extkey::ToString_abi_cxx11_(&local_1058,&base_ext_pubkey->super_Extkey);
  if (local_f60 == (undefined1  [8])local_1058._M_string_length) {
    if (local_f60 == (undefined1  [8])0x0) {
      bVar6 = true;
    }
    else {
      iVar11 = bcmp((void *)local_f68,local_1058._M_dataplus._M_p,(size_t)local_f60);
      bVar6 = iVar11 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
    operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
  }
  if (local_f68 != (undefined1  [8])local_f58) {
    operator_delete((void *)local_f68,local_f58._0_8_ + 1);
  }
  NVar8 = local_100c;
  if (bVar6) {
    Extkey::ToString_abi_cxx11_((string *)local_f68,&base_ext_pubkey->super_Extkey);
    plVar12 = (long *)::std::__cxx11::string::append(local_f68);
    local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
    psVar15 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_1058.field_2._M_allocated_capacity = *psVar15;
      local_1058.field_2._8_8_ = plVar12[3];
    }
    else {
      local_1058.field_2._M_allocated_capacity = *psVar15;
      local_1058._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_1058._M_string_length = plVar12[1];
    *plVar12 = (long)psVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if (local_f68 != (undefined1  [8])local_f58) {
      operator_delete((void *)local_f68,local_f58._0_8_ + 1);
    }
    AVar10 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_c00);
    if (AVar10 == kP2shP2wpkhAddress) {
      ::std::operator+(&local_1030,"sh(wpkh(",&local_1058);
      plVar12 = (long *)::std::__cxx11::string::append((char *)&local_1030);
    }
    else {
      AVar10 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_c00);
      if (AVar10 == kP2wpkhAddress) {
        ::std::operator+(&local_1030,"wpkh(",&local_1058);
        plVar12 = (long *)::std::__cxx11::string::append((char *)&local_1030);
      }
      else {
        ::std::operator+(&local_1030,"pkh(",&local_1058);
        plVar12 = (long *)::std::__cxx11::string::append((char *)&local_1030);
      }
    }
    pDVar14 = (DescriptorKeyReference *)(plVar12 + 2);
    if ((DescriptorKeyReference *)*plVar12 == pDVar14) {
      local_f58._0_8_ = *(undefined8 *)pDVar14;
      local_f58._8_8_ = plVar12[3];
      local_f68 = (undefined1  [8])local_f58;
    }
    else {
      local_f58._0_8_ = *(undefined8 *)pDVar14;
      local_f68 = (undefined1  [8])*plVar12;
    }
    local_f60 = (undefined1  [8])plVar12[1];
    *plVar12 = (long)pDVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_1058,(string *)local_f68);
    if (local_f68 != (undefined1  [8])local_f58) {
      operator_delete((void *)local_f68,local_f58._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1030._M_dataplus._M_p != &local_1030.field_2) {
      operator_delete(local_1030._M_dataplus._M_p,local_1030.field_2._M_allocated_capacity + 1);
    }
    Descriptor::Parse((Descriptor *)local_f68,&local_1058,
                      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)0x0,kMainnet);
    Descriptor::operator=((Descriptor *)&local_4a0,(Descriptor *)local_f68);
    DescriptorNode::~DescriptorNode((DescriptorNode *)local_f68);
    Descriptor::GetReference
              ((DescriptorScriptReference *)local_f68,(Descriptor *)&local_4a0,&local_fe8);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_c00,(DescriptorScriptReference *)local_f68);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_c18);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&local_c30);
    if (local_c38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c38._M_pi);
    }
    local_cd8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_c58);
    TapBranch::~TapBranch(&local_cd8);
    TapBranch::~TapBranch(&local_d60);
    core::Address::~Address((Address *)(local_ef0 + 8));
    Script::~Script((Script *)(local_f28 + 8));
    Script::~Script((Script *)local_f60);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_808,(DescriptorScriptReference *)local_c00);
    AVar10 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_808);
    if (AVar10 == kP2shP2wpkhAddress) {
      DescriptorScriptReference::GetChild
                ((DescriptorScriptReference *)local_f68,(DescriptorScriptReference *)local_808);
      DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)local_808,(DescriptorScriptReference *)local_f68);
      ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_c18);
      ::std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_c30);
      if (local_c38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c38._M_pi);
      }
      local_cd8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_c58);
      TapBranch::~TapBranch(&local_cd8);
      TapBranch::~TapBranch(&local_d60);
      core::Address::~Address((Address *)(local_ef0 + 8));
      Script::~Script((Script *)(local_f28 + 8));
      Script::~Script((Script *)local_f60);
    }
    DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_f68,(DescriptorScriptReference *)local_808);
    DescriptorKeyReference::operator=(&local_330,(DescriptorKeyReference *)local_f68);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_f68);
    DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_f68,&local_330);
    (__return_storage_ptr__->super_Extkey).version_ = local_f68._0_4_;
    ByteData::operator=(local_1038,(ByteData *)local_f60);
    (__return_storage_ptr__->super_Extkey).depth_ = local_f58[0x10];
    *(undefined3 *)&(__return_storage_ptr__->super_Extkey).field_0x21 = local_f58._17_3_;
    (__return_storage_ptr__->super_Extkey).child_num_ = local_f58._20_4_;
    ByteData256::operator=(local_fa0,&local_f40);
    ByteData::operator=(&local_fa8->data_,(ByteData *)local_f28);
    (__return_storage_ptr__->super_Extkey).privkey_.is_compressed_ = (bool)local_f18._8_1_;
    *(undefined3 *)&(__return_storage_ptr__->super_Extkey).privkey_.field_0x19 = local_f18._9_3_;
    (__return_storage_ptr__->super_Extkey).privkey_.net_type_ = local_f18._12_4_;
    ByteData::operator=(&this->data_,&local_f08);
    ByteData256::operator=(this_00,(ByteData256 *)local_ef0);
    if ((pointer)local_ef0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_ef0._0_8_,(long)local_ee0._M_p - local_ef0._0_8_);
    }
    if (local_f08.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f08.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f08.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f08.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_f28._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_f28._0_8_,local_f18._M_allocated_capacity - local_f28._0_8_);
    }
    if ((pointer)local_f40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f40.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f40.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f40.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f60 != (undefined1  [8])0x0) {
      operator_delete((void *)local_f60,local_f58._8_8_ - (long)local_f60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
      operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
    }
  }
  if (descriptor_derive_address != (Address *)0x0) {
    DescriptorScriptReference::GenerateAddress
              ((Address *)local_f68,(DescriptorScriptReference *)local_c00,NVar8);
    core::Address::operator=(descriptor_derive_address,(Address *)local_f68);
    core::Address::~Address((Address *)local_f68);
  }
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  ~vector(&local_8b0);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector(&local_8c8);
  if (local_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8d0._M_pi);
  }
  local_970._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_8f0);
  TapBranch::~TapBranch(&local_970);
  TapBranch::~TapBranch(&local_9f8);
  core::Address::~Address((Address *)(local_b88 + 8));
  Script::~Script((Script *)(local_bf0 + 0x38));
  Script::~Script((Script *)local_bf8);
  DescriptorKeyReference::~DescriptorKeyReference(&local_330);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  ~vector(&local_4b8);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector(&local_4d0);
  if (local_4d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d8._M_pi);
  }
  local_578._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_4f8);
  TapBranch::~TapBranch(&local_578);
  TapBranch::~TapBranch(&local_600);
  core::Address::~Address((Address *)local_788);
  Script::~Script(&local_7c0);
  Script::~Script((Script *)(local_808 + 8));
  DescriptorNode::~DescriptorNode(&local_4a0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_fe8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_fc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1008._M_dataplus._M_p != &local_1008.field_2) {
    operator_delete(local_1008._M_dataplus._M_p,local_1008.field_2._M_allocated_capacity + 1);
  }
  if (local_898.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_898.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_898.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_898.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_898.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_898.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_898.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_898.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_898.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_898.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_898.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_898.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_898.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_898.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_898.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_898.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_898.fingerprint_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_898.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_898.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_898.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ConfidentialTransaction::GenerateExtPubkeyFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &prefix, NetType net_type, NetType elements_net_type,
    ExtPubkey *base_ext_pubkey, Address *descriptor_derive_address) {
  bool is_mainnet = false;
  switch (net_type) {
    case NetType::kMainnet:
      is_mainnet = true;
      break;
    case NetType::kTestnet:
      // fall-through
    case NetType::kRegtest:
      break;
    default:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal bitcoin network type error.");
  }
  switch (elements_net_type) {
    case NetType::kMainnet:
    case NetType::kTestnet:
    case NetType::kRegtest:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal elements network type error.");
    case NetType::kLiquidV1:
    case NetType::kElementsRegtest:
    case NetType::kCustomChain:
    default:
      break;
  }

  ExtPubkey child_xpub;
  ExtPubkey xpub;
  std::string desc_str = bitcoin_descriptor;
  try {
    // check extkey (not output descriptor)
    ExtPubkey check_key(bitcoin_descriptor);
    bool is_mainnet_key = check_key.GetNetworkType() == kMainnet;
    if ((!prefix.IsEmpty()) && check_key.GetVersionData().Equals(prefix)) {
      desc_str = "pkh(" + bitcoin_descriptor + ")";  // create pkh descriptor
    } else if (is_mainnet == is_mainnet_key) {
      switch (check_key.GetFormatType()) {
        case kBip49:
          desc_str = "sh(wpkh(" + bitcoin_descriptor + "))";
          break;
        case kBip84:
          desc_str = "wpkh(" + bitcoin_descriptor + ")";
          break;
        default:
          desc_str = "pkh(" + bitcoin_descriptor + ")";
      }
    }
  } catch (const CfdException &except) {
    info(
        CFD_LOG_SOURCE, "bitcoin_descriptor check fail. go on next check.({})",
        except.what());
    // other descriptor
  }

  std::vector<std::string> arg_list_base;
  arg_list_base.push_back(std::string(kArgumentBaseExtkey));
  std::vector<std::string> arg_list;
  arg_list.push_back(std::to_string(bip32_counter));
  Descriptor desc = Descriptor::Parse(desc_str);
  DescriptorScriptReference script_ref = desc.GetReference(&arg_list_base);
  switch (script_ref.GetAddressType()) {
    case AddressType::kP2pkhAddress:
      // fall-through
    case AddressType::kP2wpkhAddress:
      // fall-through
    case AddressType::kP2shP2wpkhAddress:
      break;
    default:
      warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid type.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "bitcoin_descriptor is not of any type supported: pkh(<xpub>), "
          "sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>.");
  }

  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  DescriptorKeyReference key_ref = script_ref.GetKeyList()[0];
  if (!key_ref.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid extkey format.");
    throw CfdException(
        kCfdIllegalArgumentError, "BitcoinDescriptor invalid extkey format.");
  }
  *base_ext_pubkey = key_ref.GetExtPubkey();
  if (!prefix.IsEmpty() && !base_ext_pubkey->GetVersionData().Equals(prefix)) {
    warn(
        CFD_LOG_SOURCE, "bitcoin_descriptor illegal prefix[{}].",
        xpub.GetVersionData().GetHex());
    throw CfdException(
        kCfdIllegalArgumentError, "bitcoin_descriptor illegal prefix.");
  }

  // collect derive key
  DescriptorScriptReference derive_script;
  derive_script = desc.GetReference(&arg_list);
  script_ref = derive_script;
  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  key_ref = script_ref.GetKeyList()[0];
  child_xpub = key_ref.GetExtPubkey();

  // If it is the same as base, add a default path.
  if (child_xpub.ToString() == base_ext_pubkey->ToString()) {
    std::string xpub_str = base_ext_pubkey->ToString() + "/0/*";
    if (derive_script.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      xpub_str = "sh(wpkh(" + xpub_str + "))";
    } else if (derive_script.GetAddressType() == AddressType::kP2wpkhAddress) {
      xpub_str = "wpkh(" + xpub_str + ")";
    } else {
      xpub_str = "pkh(" + xpub_str + ")";
    }
    desc = Descriptor::Parse(xpub_str);
    derive_script = desc.GetReference(&arg_list);
    script_ref = derive_script;
    if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      script_ref = script_ref.GetChild();
    }
    key_ref = script_ref.GetKeyList()[0];
    child_xpub = key_ref.GetExtPubkey();
  }

  if (descriptor_derive_address != nullptr) {
    *descriptor_derive_address = derive_script.GenerateAddress(net_type);
  }
  return child_xpub;
}